

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O3

Statement *
slang::ast::RandSequenceStatement::fromSyntax
          (Compilation *comp,RandSequenceStatementSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  int iVar1;
  specific_symbol_iterator<slang::ast::RandSeqProductionSymbol> sVar2;
  RandSeqProductionSymbol *pRVar3;
  SourceLocation SVar4;
  undefined4 extraout_var;
  RandSequenceStatement *pRVar5;
  specific_symbol_iterator<slang::ast::RandSeqProductionSymbol> sVar6;
  SourceLocation extraout_RDX;
  SourceLocation extraout_RDX_00;
  specific_symbol_iterator<slang::ast::RandSeqProductionSymbol> src;
  SourceLocation extraout_RDX_01;
  SourceLocation extraout_RDX_02;
  RandSeqProductionSymbol *prod;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::RandSeqProductionSymbol>,_(std::ranges::subrange_kind)0>
  sVar7;
  SourceRange SVar8;
  string_view name;
  RandSeqProductionSymbol *firstProd;
  SmallVector<const_slang::ast::Expression_*,_5UL> args;
  SmallVector<const_slang::ast::RandSeqProductionSymbol_*,_5UL> productions;
  RandSeqProductionSymbol *local_e0;
  Compilation *local_d8;
  SourceRange local_d0;
  SmallVectorBase<const_slang::ast::Expression_*> local_c0 [2];
  SmallVectorBase<const_slang::ast::RandSeqProductionSymbol_*> local_80 [2];
  SourceRange local_40;
  
  local_80[0].data_ = (pointer)local_80[0].firstElement;
  local_80[0].len = 0;
  local_80[0].cap = 5;
  local_d8 = comp;
  sVar7 = Scope::membersOfType<slang::ast::RandSeqProductionSymbol>((context->scope).ptr);
  sVar6 = sVar7._M_end.current;
  sVar2 = sVar7._M_begin.current;
  src.current = sVar6.current;
  if (sVar2.current != sVar6.current) {
    do {
      local_c0[0].data_ = (pointer)sVar2.current;
      SmallVectorBase<slang::ast::RandSeqProductionSymbol_const*>::
      emplace_back<slang::ast::RandSeqProductionSymbol_const*>
                ((SmallVectorBase<slang::ast::RandSeqProductionSymbol_const*> *)local_80,
                 (RandSeqProductionSymbol **)local_c0);
      do {
        sVar2.current = *(Symbol **)((long)sVar2.current + 0x28);
        if ((SourceLocation)sVar2.current == (SourceLocation)0x0) {
          sVar2.current = (Symbol *)0x0;
          break;
        }
      } while (*(int *)sVar2.current != 0x59);
      src.current = (Symbol *)extraout_RDX;
    } while (sVar2.current != sVar6.current);
  }
  local_e0 = (RandSeqProductionSymbol *)0x0;
  if ((syntax->firstProduction).info == (Info *)0x0) {
    if (local_80[0].len == 0) goto LAB_0044eb33;
    pRVar3 = *local_80[0].data_;
    local_e0 = pRVar3;
    SVar4 = parsing::Token::location(&syntax->randsequence);
    SVar8 = parsing::Token::range(&syntax->closeParen);
    src.current = (Symbol *)SVar8.endLoc;
    SVar8.endLoc = (SourceLocation)src.current;
    SVar8.startLoc = SVar4;
  }
  else {
    SVar8 = parsing::Token::range(&syntax->firstProduction);
    name = parsing::Token::valueText(&syntax->firstProduction);
    pRVar3 = RandSeqProductionSymbol::findProduction(name,SVar8,context);
    src.current = (Symbol *)extraout_RDX_00;
    local_e0 = pRVar3;
  }
  if (pRVar3 != (RandSeqProductionSymbol *)0x0) {
    local_c0[0].len = 0;
    local_c0[0].cap = 5;
    local_d0 = SVar8;
    local_c0[0].data_ = (pointer)local_c0[0].firstElement;
    CallExpression::bindArgs
              ((ArgumentListSyntax *)0x0,pRVar3->arguments,(pRVar3->super_Symbol).name,SVar8,context
               ,local_c0,false);
    src.current = (Symbol *)extraout_RDX_01;
    if (local_c0[0].data_ != (pointer)local_c0[0].firstElement) {
      operator_delete(local_c0[0].data_);
      src.current = (Symbol *)extraout_RDX_02;
    }
  }
LAB_0044eb33:
  this = local_d8;
  iVar1 = SmallVectorBase<const_slang::ast::RandSeqProductionSymbol_*>::copy
                    (local_80,(EVP_PKEY_CTX *)local_d8,(EVP_PKEY_CTX *)src.current);
  local_c0[0].data_ = (pointer)CONCAT44(extraout_var,iVar1);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pRVar5 = BumpAllocator::
           emplace<slang::ast::RandSequenceStatement,slang::ast::RandSeqProductionSymbol_const*&,std::span<slang::ast::RandSeqProductionSymbol_const*,18446744073709551615ul>,slang::SourceRange>
                     (&this->super_BumpAllocator,&local_e0,
                      (span<const_slang::ast::RandSeqProductionSymbol_*,_18446744073709551615UL> *)
                      local_c0,&local_40);
  if (local_80[0].data_ != (pointer)local_80[0].firstElement) {
    operator_delete(local_80[0].data_);
  }
  return &pRVar5->super_Statement;
}

Assistant:

Statement& RandSequenceStatement::fromSyntax(Compilation& comp,
                                             const RandSequenceStatementSyntax& syntax,
                                             const ASTContext& context) {
    SmallVector<const RandSeqProductionSymbol*> productions;
    for (auto& prod : context.scope->membersOfType<RandSeqProductionSymbol>())
        productions.push_back(&prod);

    SourceRange firstProdRange;
    const RandSeqProductionSymbol* firstProd = nullptr;
    if (syntax.firstProduction) {
        firstProdRange = syntax.firstProduction.range();
        firstProd = RandSeqProductionSymbol::findProduction(syntax.firstProduction.valueText(),
                                                            firstProdRange, context);
    }
    else if (!productions.empty()) {
        firstProd = productions[0];
        firstProdRange = {syntax.randsequence.location(), syntax.closeParen.range().end()};
    }

    if (firstProd) {
        // Make sure the first production doesn't require arguments.
        SmallVector<const Expression*> args;
        CallExpression::bindArgs(nullptr, firstProd->arguments, firstProd->name, firstProdRange,
                                 context, args, /* isBuiltInMethod */ false);
    }

    // All of the logic for creating productions is in the RandSeqProduction symbol.
    return *comp.emplace<RandSequenceStatement>(firstProd, productions.copy(comp),
                                                syntax.sourceRange());
}